

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::BlockGroup::BlockGroup
          (BlockGroup *this,Cluster *pCluster,long idx,longlong block_start,longlong block_size,
          longlong prev,longlong next,longlong duration,longlong discard_padding)

{
  longlong in_RCX;
  long in_RDX;
  Cluster *in_RSI;
  BlockEntry *in_RDI;
  longlong in_R8;
  Cluster *in_R9;
  long in_stack_00000008;
  _func_int **in_stack_00000010;
  
  BlockEntry::BlockEntry(in_RDI,in_RSI,in_RDX);
  in_RDI->_vptr_BlockEntry = (_func_int **)&PTR__BlockGroup_00c7e9b8;
  Block::Block((Block *)(in_RDI + 1),in_RCX,in_R8,prev);
  in_RDI[3].m_pCluster = in_R9;
  in_RDI[3].m_index = in_stack_00000008;
  in_RDI[4]._vptr_BlockEntry = in_stack_00000010;
  return;
}

Assistant:

BlockGroup::BlockGroup(Cluster* pCluster, long idx, long long block_start,
                       long long block_size, long long prev, long long next,
                       long long duration, long long discard_padding)
    : BlockEntry(pCluster, idx),
      m_block(block_start, block_size, discard_padding),
      m_prev(prev),
      m_next(next),
      m_duration(duration) {}